

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O0

int emit_match(deflate_state *s,match match)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  deflate_state *in_RDI;
  int bflush;
  int local_1c;
  undefined8 local_c;
  int local_4;
  
  local_1c = 0;
  local_c._2_2_ = (ushort)((ulong)in_RSI >> 0x10);
  lVar1 = in_RSI;
  if (local_c._2_2_ < 4) {
    while (local_c = lVar1, local_c._2_2_ != 0) {
      iVar2 = zng_tr_tally_lit(in_RDI,in_RDI->window[local_c._4_2_]);
      local_1c = iVar2 + local_1c;
      in_RDI->lookahead = in_RDI->lookahead - 1;
      local_c = (ulong)CONCAT22(local_c._4_2_ + 1,local_c._2_2_ + -1) << 0x10;
      lVar1 = local_c;
    }
    local_4 = local_1c;
  }
  else {
    local_c._4_2_ = (ushort)((ulong)in_RSI >> 0x20);
    local_c._0_2_ = (ushort)in_RSI;
    local_4 = zng_tr_tally_dist(in_RDI,(uint)local_c._4_2_ - (uint)(ushort)local_c,local_c._2_2_ - 3
                               );
    in_RDI->lookahead = in_RDI->lookahead - (uint)local_c._2_2_;
  }
  return local_4;
}

Assistant:

static int emit_match(deflate_state *s, struct match match) {
    int bflush = 0;

    /* matches that are not long enough we need to emit as literals */
    if (match.match_length < WANT_MIN_MATCH) {
        while (match.match_length) {
            bflush += zng_tr_tally_lit(s, s->window[match.strstart]);
            s->lookahead--;
            match.strstart++;
            match.match_length--;
        }
        return bflush;
    }

    check_match(s, match.strstart, match.match_start, match.match_length);

    bflush += zng_tr_tally_dist(s, match.strstart - match.match_start, match.match_length - STD_MIN_MATCH);

    s->lookahead -= match.match_length;
    return bflush;
}